

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O0

size_t __thiscall v_array<node_pred>::unique_add_sorted(v_array<node_pred> *this,node_pred *new_ele)

{
  undefined8 *puVar1;
  bool bVar2;
  long lVar3;
  undefined8 *in_RSI;
  long *in_RDI;
  size_t *in_stack_00000008;
  size_t to_move;
  size_t size;
  size_t index;
  size_t in_stack_000001b8;
  v_array<node_pred> *in_stack_000001c0;
  
  lVar3 = (in_RDI[1] - *in_RDI) / 0x18;
  bVar2 = contain_sorted((v_array<node_pred> *)size,(node_pred *)to_move,in_stack_00000008);
  if (!bVar2) {
    if (in_RDI[1] == in_RDI[2]) {
      resize(in_stack_000001c0,in_stack_000001b8);
    }
    if (lVar3 != 0) {
      memmove((void *)(*in_RDI + 0x18),(void *)*in_RDI,lVar3 * 0x18);
    }
    puVar1 = (undefined8 *)*in_RDI;
    *puVar1 = *in_RSI;
    puVar1[1] = in_RSI[1];
    puVar1[2] = in_RSI[2];
    in_RDI[1] = in_RDI[1] + 0x18;
  }
  return 0;
}

Assistant:

size_t unique_add_sorted(const T& new_ele)
  {
    size_t index = 0;
    size_t size = _end - _begin;
    size_t to_move;

    if (!contain_sorted(new_ele, index))
    {
      if (_end == end_array)
        resize(2 * (end_array - _begin) + 3);

      to_move = size - index;

      if (to_move > 0)
        memmove(_begin + index + 1, _begin + index,
            to_move * sizeof(T));  // kopiuje to_move*.. bytow z _begin+index do _begin+index+1

      _begin[index] = new_ele;

      _end++;
    }

    return index;
  }